

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O3

UINT8 DataLoader_Load(DATA_LOADER *loader)

{
  UINT8 UVar1;
  UINT32 UVar2;
  
  UVar1 = '\x01';
  if (loader->_status != '\x01') {
    DataLoader_Reset(loader);
    UVar1 = (*loader->_callbacks->dopen)(loader->_context);
    if (UVar1 == '\0') {
      loader->_bytesLoaded = 0;
      loader->_status = '\x01';
      UVar2 = (*loader->_callbacks->dlength)(loader->_context);
      loader->_bytesTotal = UVar2;
      if (loader->_readStopOfs != 0) {
        DataLoader_Read(loader,loader->_readStopOfs);
      }
      UVar1 = '\0';
    }
  }
  return UVar1;
}

Assistant:

UINT8 DataLoader_Load(DATA_LOADER *loader)
{
	UINT8 ret;
	if (loader->_status == DLSTAT_LOADING)
		return 0x01;

	DataLoader_Reset(loader);

	ret = loader->_callbacks->dopen(loader->_context);
	if(ret) return ret;

	loader->_bytesLoaded = 0x00;
	loader->_status = DLSTAT_LOADING;
	loader->_bytesTotal = loader->_callbacks->dlength(loader->_context);

	if (loader->_readStopOfs > 0)
		DataLoader_Read(loader,loader->_readStopOfs);

	return 0x00;
}